

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall
CRegexParser::build_concat
          (CRegexParser *this,re_machine *new_machine,re_machine *lhs,re_machine *rhs)

{
  re_tuple *prVar1;
  re_state_id rVar2;
  
  rVar2 = alloc_state(this);
  new_machine->init = rVar2;
  rVar2 = alloc_state(this);
  new_machine->final = rVar2;
  if ((long)new_machine->init != -1) {
    rVar2 = lhs->init;
    prVar1 = this->tuple_arr_ + new_machine->init;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_EPSILON;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  if ((long)lhs->final != -1) {
    rVar2 = rhs->init;
    prVar1 = this->tuple_arr_ + lhs->final;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_EPSILON;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  if ((long)rhs->final != -1) {
    rVar2 = new_machine->final;
    prVar1 = this->tuple_arr_ + rhs->final;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_EPSILON;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar2;
    }
    else {
      prVar1->next_state_2 = rVar2;
    }
  }
  return;
}

Assistant:

void CRegexParser::build_concat(re_machine *new_machine,
                                re_machine *lhs, re_machine *rhs)
{
    /* initialize the new machine */
    init_machine(new_machine);

    /* 
     *   set up an epsilon transition from the new machine's initial state
     *   to the first submachine's initial state 
     */
    set_trans(new_machine->init, lhs->init, RE_EPSILON, 0);

    /*
     *   Set up an epsilon transition from the first submachine's final
     *   state to the second submachine's initial state 
     */
    set_trans(lhs->final, rhs->init, RE_EPSILON, 0);

    /*
     *   Set up an epsilon transition from the second submachine's final
     *   state to our new machine's final state 
     */
    set_trans(rhs->final, new_machine->final, RE_EPSILON, 0);
}